

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O0

void la_b64_encode(archive_string *as,uchar *p,size_t len)

{
  uint uVar1;
  size_t sStack_20;
  wchar_t c;
  size_t len_local;
  uchar *p_local;
  archive_string *as_local;
  
  len_local = (size_t)p;
  for (sStack_20 = len; 2 < sStack_20; sStack_20 = sStack_20 - 3) {
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)(uint)*(byte *)len_local >> 2]);
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((*(byte *)len_local & 3) << 4 | (int)(*(byte *)(len_local + 1) & 0xf0) >> 4
                        )]);
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((*(byte *)(len_local + 1) & 0xf) << 2 |
                        (int)(*(byte *)(len_local + 2) & 0xc0) >> 6)]);
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)(*(byte *)(len_local + 2) & 0x3f)]);
    len_local = len_local + 3;
  }
  if (sStack_20 != 0) {
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)(uint)*(byte *)len_local >> 2]);
    uVar1 = (*(byte *)len_local & 3) << 4;
    if (sStack_20 == 1) {
      archive_strappend_char
                (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(int)uVar1]);
      archive_strappend_char(as,'=');
      archive_strappend_char(as,'=');
    }
    else {
      archive_strappend_char
                (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)((int)(*(byte *)(len_local + 1) & 0xf0) >> 4 | uVar1)]);
      archive_strappend_char
                (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)((*(byte *)(len_local + 1) & 0xf) << 2)]);
      archive_strappend_char(as,'=');
    }
  }
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
la_b64_encode(struct archive_string *as, const unsigned char *p, size_t len)
{
	int c;

	for (; len >= 3; p += 3, len -= 3) {
		c = p[0] >> 2;
		archive_strappend_char(as, base64[c]);
		c = ((p[0] & 0x03) << 4) | ((p[1] & 0xf0) >> 4);
		archive_strappend_char(as, base64[c]);
		c = ((p[1] & 0x0f) << 2) | ((p[2] & 0xc0) >> 6);
		archive_strappend_char(as, base64[c]);
		c = p[2] & 0x3f;
		archive_strappend_char(as, base64[c]);
	}
	if (len > 0) {
		c = p[0] >> 2;
		archive_strappend_char(as, base64[c]);
		c = (p[0] & 0x03) << 4;
		if (len == 1) {
			archive_strappend_char(as, base64[c]);
			archive_strappend_char(as, '=');
			archive_strappend_char(as, '=');
		} else {
			c |= (p[1] & 0xf0) >> 4;
			archive_strappend_char(as, base64[c]);
			c = (p[1] & 0x0f) << 2;
			archive_strappend_char(as, base64[c]);
			archive_strappend_char(as, '=');
		}
	}
	archive_strappend_char(as, '\n');
}